

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

bool __thiscall Jinx::Impl::Script::IsIntegerPair(Script *this,Variant *value)

{
  long lVar1;
  bool bVar2;
  CollectionPtr coll;
  long local_18;
  undefined8 local_10;
  
  if (value->m_type == Collection) {
    Variant::GetCollection((Variant *)&stack0xffffffffffffffe8);
    if ((*(long *)(local_18 + 0x28) == 2) && (*(int *)(*(long *)(local_18 + 0x18) + 0x20) == 2)) {
      lVar1 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(local_18 + 8));
      bVar2 = *(int *)(lVar1 + 0x20) == 2;
    }
    else {
      bVar2 = false;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsCollection() const { return m_type == ValueType::Collection ? true : false; }